

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::added2Set
          (SPxLPBase<double> *this,SVSetBase<double> *set,SVSetBase<double> *addset,int n)

{
  Item *pIVar1;
  DataKey *pDVar2;
  Nonzero<double> *pNVar3;
  int *piVar4;
  int iVar5;
  Item *pIVar6;
  DataKey *pDVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int *piVar13;
  int newmax;
  int *local_40;
  undefined8 local_38;
  
  if (n != 0) {
    iVar11 = (set->set).thenum;
    local_40 = (int *)0x0;
    local_38 = 0x3ff3333333333333;
    newmax = 0;
    iVar5 = iVar11;
    if (iVar11 < 1) {
      iVar5 = 0;
    }
    iVar9 = 1;
    if (0 < iVar11) {
      iVar9 = iVar5;
    }
    spx_alloc<int*>(&local_40,iVar9);
    piVar4 = local_40;
    lVar8 = (long)(set->set).thenum;
    if (0 < lVar8) {
      memset(local_40,0,lVar8 << 2);
    }
    if (0 < n) {
      iVar11 = (addset->set).thenum;
      pIVar6 = (addset->set).theitem;
      pDVar7 = (addset->set).thekey;
      lVar8 = (long)(iVar11 - n);
      newmax = 0;
      do {
        iVar5 = pDVar7[lVar8].idx;
        iVar9 = pIVar6[iVar5].data.super_SVectorBase<double>.memused;
        lVar10 = (long)iVar9;
        if (0 < lVar10) {
          uVar12 = lVar10 + 1;
          piVar13 = &pIVar6[iVar5].data.super_SVectorBase<double>.m_elem[lVar10 + -1].idx;
          do {
            piVar4[*piVar13] = piVar4[*piVar13] + 1;
            uVar12 = uVar12 - 1;
            piVar13 = piVar13 + -4;
          } while (1 < uVar12);
        }
        newmax = newmax + iVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar11);
    }
    if ((set->super_ClassArray<soplex::Nonzero<double>_>).themax < newmax) {
      SVSetBase<double>::memRemax(set,newmax);
    }
    lVar8 = (long)(set->set).thenum;
    if (0 < lVar8) {
      pIVar6 = (set->set).theitem;
      pDVar7 = (set->set).thekey;
      uVar12 = lVar8 + 1;
      do {
        iVar11 = pIVar6[pDVar7[uVar12 - 2].idx].data.super_SVectorBase<double>.memused;
        SVSetBase<double>::xtend
                  (set,(SVectorBase<double> *)(pIVar6 + pDVar7[uVar12 - 2].idx),
                   piVar4[uVar12 - 2] + iVar11);
        pIVar6 = (set->set).theitem;
        pDVar7 = (set->set).thekey;
        pIVar6[pDVar7[uVar12 - 2].idx].data.super_SVectorBase<double>.memused =
             piVar4[uVar12 - 2] + iVar11;
        piVar4[uVar12 - 2] = iVar11;
        uVar12 = uVar12 - 1;
      } while (1 < uVar12);
    }
    if (0 < n) {
      iVar11 = (addset->set).thenum;
      pIVar6 = (addset->set).theitem;
      pDVar7 = (addset->set).thekey;
      pIVar1 = (set->set).theitem;
      pDVar2 = (set->set).thekey;
      lVar8 = (long)(iVar11 - n);
      do {
        iVar5 = pDVar7[lVar8].idx;
        lVar10 = (long)pIVar6[iVar5].data.super_SVectorBase<double>.memused;
        if (0 < lVar10) {
          uVar12 = lVar10 + 1;
          piVar13 = &pIVar6[iVar5].data.super_SVectorBase<double>.m_elem[lVar10 + -1].idx;
          do {
            iVar11 = *piVar13;
            iVar5 = piVar4[iVar11];
            piVar4[iVar11] = iVar5 + 1;
            pNVar3 = pIVar1[pDVar2[iVar11].idx].data.super_SVectorBase<double>.m_elem;
            pNVar3[iVar5].idx = (int)lVar8;
            pNVar3[iVar5].val = ((Nonzero<double> *)(piVar13 + -2))->val;
            uVar12 = uVar12 - 1;
            piVar13 = piVar13 + -4;
          } while (1 < uVar12);
          iVar11 = (addset->set).thenum;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar11);
    }
    if (local_40 != (int *)0x0) {
      free(local_40);
    }
  }
  return;
}

Assistant:

void added2Set(SVSetBase<R>& set, const SVSetBase<R>& addset, int n)
   {

      if(n == 0)
         return;

      DataArray<int> moreArray(set.num());
      int* more = moreArray.get_ptr();

      for(int i = set.num() - 1; i >= 0; --i)
         more[i] = 0;

      int tot = 0;
      int end = addset.num();

      for(int i = addset.num() - n; i < end; ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         tot += vec.size();

         for(int j = vec.size() - 1; j >= 0; --j)
            more[vec.index(j)]++;
      }

      if(set.memMax() < tot)
         set.memRemax(tot);

      for(int i = set.num() - 1; i >= 0; --i)
      {
         int j = set[i].size();
         set.xtend(set[i], j + more[i]);
         set[i].set_size(j + more[i]);
         more[i] = j;
      }

      for(int i = addset.num() - n; i < addset.num(); ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         for(int j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            int m = more[k]++;
            SVectorBase<R>& l_xtend = set[k];
            l_xtend.index(m) = i;
            l_xtend.value(m) = vec.value(j);
         }
      }
   }